

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackArraySizeValidator::
validateSingleVariable
          (TransformFeedbackArraySizeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  bool bVar1;
  const_reference pvVar2;
  VarType *pVVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  int local_37c;
  allocator<char> local_369;
  string local_368;
  MessageBuilder local_348;
  MessageBuilder local_1b8;
  int local_34;
  string *psStack_30;
  int arraySize;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  TransformFeedbackArraySizeValidator *this_local;
  
  psStack_30 = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  pvVar2 = std::
           vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           ::back(path);
  pVVar3 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar2);
  bVar1 = glu::VarType::isArrayType(pVVar3);
  if (bVar1) {
    pvVar2 = std::
             vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
             ::back((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     *)resource_local);
    pVVar3 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(pvVar2);
    local_37c = glu::VarType::getArraySize(pVVar3);
  }
  else {
    local_37c = 1;
  }
  local_34 = local_37c;
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx
                     );
  tcu::TestLog::operator<<(&local_1b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [33])"Verifying array size, expecting ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_34);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  if (local_34 != implementationName_local._4_4_) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TransformFeedbackResourceValidator).super_PropValidator.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_348,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [13])"\tError, got ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&implementationName_local + 4));
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"resource array size invalid",&local_369);
    PropValidator::setError((PropValidator *)this,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator(&local_369);
  }
  return;
}

Assistant:

void TransformFeedbackArraySizeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	const int arraySize = (path.back().getVariableType()->isArrayType()) ? (path.back().getVariableType()->getArraySize()) : (1);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array size, expecting " << arraySize << tcu::TestLog::EndMessage;
	if (arraySize != propValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
		setError("resource array size invalid");
	}
}